

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFill.cpp
# Opt level: O0

bool __thiscall CDirectiveFill::Validate(CDirectiveFill *this)

{
  bool bVar1;
  u64 uVar2;
  uint local_1c;
  CDirectiveFill *pCStack_18;
  int NewSize;
  CDirectiveFill *this_local;
  
  pCStack_18 = this;
  uVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar2;
  bVar1 = evalExpression(&this->SizeExpression,(int *)&local_1c,true);
  if (bVar1) {
    if (((this->FillByte & 1U) != 1) ||
       (bVar1 = evalExpression(&this->ByteExpression,&this->Byte,true), bVar1)) {
      FileManager::advanceMemory(g_fileManager,(long)(int)local_1c);
      if (this->Size == (long)(int)local_1c) {
        this_local._7_1_ = false;
      }
      else {
        this->Size = (ulong)local_1c;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CDirectiveFill::Validate()
{
	int NewSize;

	RamPos = g_fileManager->getVirtualAddress();
	if (evalExpression(SizeExpression,NewSize,true) == false)
		return false;

	if (FillByte == true)
	{
		if (evalExpression(ByteExpression,Byte,true) == false)
			return false;
	}

	g_fileManager->advanceMemory(NewSize);

	if (Size != NewSize)
	{
		Size = (u32)NewSize;
		return true;
	} else {
		return false;
	}
}